

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShallowSerializer.hpp
# Opt level: O2

void supermap::io::ShallowSerializer<int>::serialize(int *value,ostream *os)

{
  long lVar1;
  long lVar2;
  IOException *this;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = std::ostream::tellp();
  std::ostream::write((char *)os,(long)value);
  lVar2 = std::ostream::tellp();
  if (lVar2 - lVar1 == 4) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_c0,4);
  std::operator+(&local_a0,"Attempted to write ",&local_c0);
  std::operator+(&local_80,&local_a0," bytes, but only ");
  lVar2 = std::ostream::tellp();
  std::__cxx11::to_string(&local_e0,lVar2 - lVar1);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60," succeeded");
  supermap::IOException::IOException(this,(string *)&local_40);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void serialize(const T &value, std::ostream &os) {
        auto posBefore = os.tellp();
        os.write(reinterpret_cast<const char *>(&value), sizeof(T));
        if (os.tellp() - posBefore != sizeof(T)) {
            throw IOException(
                "Attempted to write " + std::to_string(sizeof(T)) +
                    " bytes, but only " + std::to_string(os.tellp() - posBefore) +
                    " succeeded"
            );
        }
    }